

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeSetPagerFlags(Btree *p,uint pgFlags)

{
  BtShared *pBVar1;
  Pager *pPVar2;
  int extraout_EAX;
  u8 uVar3;
  u8 uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  
  pBVar1 = p->pBt;
  sqlite3BtreeEnter(p);
  pPVar2 = pBVar1->pPager;
  if (pPVar2->tempFile == '\0') {
    uVar5 = pgFlags & 7;
    bVar7 = uVar5 == 1;
    bVar6 = 2 < uVar5;
    bVar8 = uVar5 == 4;
  }
  else {
    bVar7 = true;
    bVar6 = false;
    bVar8 = false;
  }
  pPVar2->noSync = bVar7;
  pPVar2->fullSync = bVar6;
  pPVar2->extraSync = bVar8;
  if (bVar7 == false) {
    if ((pgFlags & 8) == 0) {
      pPVar2->syncFlags = '\x02';
      if ((pgFlags & 0x10) == 0) {
        pPVar2->ckptSyncFlags = '\x02';
      }
      else {
        pPVar2->ckptSyncFlags = '\x03';
      }
      uVar4 = '\x02';
      goto LAB_0023bf3e;
    }
    uVar4 = '\x03';
  }
  else {
    uVar4 = '\0';
  }
  pPVar2->syncFlags = uVar4;
  pPVar2->ckptSyncFlags = uVar4;
LAB_0023bf3e:
  uVar3 = uVar4 + ' ';
  if (bVar6 == false) {
    uVar3 = uVar4;
  }
  pPVar2->walSyncFlags = uVar3;
  pPVar2->doNotSpill = pPVar2->doNotSpill & 0xfe | (pgFlags & 0x20) == 0;
  sqlite3BtreeLeave(p);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetPagerFlags(
  Btree *p,              /* The btree to set the safety level on */
  unsigned pgFlags       /* Various PAGER_* flags */
){
  BtShared *pBt = p->pBt;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  sqlite3PagerSetFlags(pBt->pPager, pgFlags);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}